

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

CompressionFunction *
duckdb::ConstantFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType data_type)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,data_type);
  switch(iVar1) {
  case 1:
  case 3:
    ConstantGetFunction<signed_char>(data_type);
    break;
  case 2:
    ConstantGetFunction<unsigned_char>(UINT8);
    break;
  case 4:
    ConstantGetFunction<unsigned_short>(UINT16);
    break;
  case 5:
    ConstantGetFunction<short>(INT16);
    break;
  case 6:
    ConstantGetFunction<unsigned_int>(UINT32);
    break;
  case 7:
    ConstantGetFunction<int>(INT32);
    break;
  case 8:
    ConstantGetFunction<unsigned_long>(UINT64);
    break;
  case 9:
    ConstantGetFunction<long>(INT64);
    break;
  case 10:
switchD_01a1da31_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unsupported type for ConstantUncompressed::GetFunction",
               &local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    ConstantGetFunction<float>(FLOAT);
    break;
  case 0xc:
    ConstantGetFunction<double>(DOUBLE);
    break;
  default:
    if (iVar1 == 0xcb) {
      ConstantGetFunction<duckdb::uhugeint_t>(UINT128);
    }
    else if (iVar1 == 0xcc) {
      ConstantGetFunction<duckdb::hugeint_t>(INT128);
    }
    else {
      if (iVar1 != 0xce) goto switchD_01a1da31_caseD_a;
      ConstantGetFunctionValidity(BIT);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction ConstantFun::GetFunction(PhysicalType data_type) {
	switch (data_type) {
	case PhysicalType::BIT:
		return ConstantGetFunctionValidity(data_type);
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return ConstantGetFunction<int8_t>(data_type);
	case PhysicalType::INT16:
		return ConstantGetFunction<int16_t>(data_type);
	case PhysicalType::INT32:
		return ConstantGetFunction<int32_t>(data_type);
	case PhysicalType::INT64:
		return ConstantGetFunction<int64_t>(data_type);
	case PhysicalType::UINT8:
		return ConstantGetFunction<uint8_t>(data_type);
	case PhysicalType::UINT16:
		return ConstantGetFunction<uint16_t>(data_type);
	case PhysicalType::UINT32:
		return ConstantGetFunction<uint32_t>(data_type);
	case PhysicalType::UINT64:
		return ConstantGetFunction<uint64_t>(data_type);
	case PhysicalType::INT128:
		return ConstantGetFunction<hugeint_t>(data_type);
	case PhysicalType::UINT128:
		return ConstantGetFunction<uhugeint_t>(data_type);
	case PhysicalType::FLOAT:
		return ConstantGetFunction<float>(data_type);
	case PhysicalType::DOUBLE:
		return ConstantGetFunction<double>(data_type);
	default:
		throw InternalException("Unsupported type for ConstantUncompressed::GetFunction");
	}
}